

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEndCapStyle ON_SubDEndCapStyleFromUnsigned(uint subd_cap_style_as_unsigned)

{
  ON_SubDEndCapStyle local_9;
  uint subd_cap_style_as_unsigned_local;
  
  switch(subd_cap_style_as_unsigned) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = None;
    break;
  case 2:
    local_9 = Triangles;
    break;
  case 3:
    local_9 = Quads;
    break;
  case 4:
    local_9 = Ngon;
    break;
  default:
    ON_SubDIncrementErrorCount();
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_SubDEndCapStyle ON_SubDEndCapStyleFromUnsigned(
  unsigned int subd_cap_style_as_unsigned
)
{
  switch (subd_cap_style_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Unset);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::None);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Triangles);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Quads);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Ngon);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDEndCapStyle::Unset);
}